

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlWriter::XmlWriter(XmlWriter *this,ostream *os)

{
  undefined8 in_RSI;
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x129ccc);
  std::__cxx11::string::string((string *)(in_RDI + 0x20));
  *(undefined8 *)(in_RDI + 0x40) = in_RSI;
  writeDeclaration((XmlWriter *)0x129cf2);
  return;
}

Assistant:

XmlWriter::XmlWriter( std::ostream& os ) : m_os( os )
    {
        writeDeclaration();
    }